

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_multiscale(REF_GRID ref_grid,REF_DBL target_complexity)

{
  uint uVar1;
  REF_STATUS RVar2;
  int iVar3;
  double dVar4;
  REF_DBL local_2c8;
  REF_FACELIFT local_2c0;
  double local_2b0;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  int local_1e4;
  REF_INT cell;
  REF_INT cell_node;
  REF_BOOL steps;
  REF_BOOL verbose;
  REF_DBL n [3];
  REF_DBL local_1b8;
  REF_DBL s [3];
  REF_DBL local_198;
  REF_DBL r [3];
  REF_DBL local_178;
  REF_DBL combined [6];
  REF_DBL m [6];
  REF_DBL diag_system [12];
  REF_DBL diag_system2 [6];
  REF_DBL complexity_scale;
  REF_DBL area;
  REF_DBL complexity;
  REF_DBL exponent;
  REF_DBL det;
  int local_58;
  REF_INT gradation;
  REF_INT p_norm;
  REF_INT dimension;
  REF_INT i;
  REF_INT node;
  REF_DBL *metric;
  REF_DBL *hess;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_FACELIFT ref_facelift;
  REF_DBL target_complexity_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  gradation = 2;
  local_58 = 2;
  det._4_4_ = -1;
  ref_node = (REF_NODE)ref_grid->geom->ref_facelift;
  ref_facelift = (REF_FACELIFT)target_complexity;
  target_complexity_local = (REF_DBL)ref_grid;
  if (ref_node != (REF_NODE)0x0) {
    ref_facelift_free((REF_FACELIFT)ref_node);
  }
  ref_node = (REF_NODE)0x0;
  uVar1 = ref_facelift_attach((REF_GRID)target_complexity_local);
  if (uVar1 == 0) {
    ref_node = *(REF_NODE *)(*(long *)((long)target_complexity_local + 0x98) + 0xe8);
    hess = (REF_DBL *)ref_node->sorted_local;
    complexity = -1.0 / (double)(local_58 * 2 + gradation);
    if (ref_cell->last_node_is_an_id * 6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x591,"ref_facelift_multiscale","malloc metric of REF_DBL negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      _i = (REF_DBL *)malloc((long)(ref_cell->last_node_is_an_id * 6) << 3);
      if (_i == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x591,"ref_facelift_multiscale","malloc metric of REF_DBL NULL");
        ref_grid_local._4_4_ = 2;
      }
      else if (*(int *)(*(long *)((long)target_complexity_local + 8) + 4) * 3 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x593,"ref_facelift_multiscale","malloc hess of REF_DBL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        metric = (REF_DBL *)
                 malloc((long)(*(int *)(*(long *)((long)target_complexity_local + 8) + 4) * 3) << 3)
        ;
        if (metric == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x593,"ref_facelift_multiscale","malloc hess of REF_DBL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_2 = 0;
              iVar3 = *(int *)(*(long *)((long)target_complexity_local + 8) + 4),
              SBORROW4(ref_private_macro_code_rss_2,iVar3 * 3) !=
              ref_private_macro_code_rss_2 + iVar3 * -3 < 0;
              ref_private_macro_code_rss_2 = ref_private_macro_code_rss_2 + 1) {
            metric[ref_private_macro_code_rss_2] = 0.0;
          }
          uVar1 = ref_recon_rsn_hess_face((REF_GRID)target_complexity_local,metric);
          if (uVar1 == 0) {
            for (dimension = 0; dimension < ref_cell->last_node_is_an_id; dimension = dimension + 1)
            {
              if (((-1 < dimension) && (dimension < ref_cell->last_node_is_an_id)) &&
                 (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)dimension * 8))) {
                uVar1 = ref_matrix_det_m2(metric + dimension * 3,&exponent);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x596,"ref_facelift_multiscale",(ulong)uVar1,"2x2 det");
                  return uVar1;
                }
                if (0.0 < exponent) {
                  for (p_norm = 0; p_norm < 3; p_norm = p_norm + 1) {
                    dVar4 = pow(exponent,complexity);
                    iVar3 = p_norm + dimension * 3;
                    metric[iVar3] = dVar4 * metric[iVar3];
                  }
                }
              }
            }
            area = 0.0;
            for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)hess + 0x2c);
                nodes[0x1a] = nodes[0x1a] + 1) {
              RVar2 = ref_cell_nodes((REF_CELL)hess,nodes[0x1a],&ref_malloc_init_i);
              if (RVar2 == 0) {
                uVar1 = ref_node_tri_area((REF_NODE)ref_cell,&ref_malloc_init_i,&complexity_scale);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x59e,"ref_facelift_multiscale",(ulong)uVar1,"area");
                  return uVar1;
                }
                for (local_1e4 = 0; local_1e4 < *(int *)((long)hess + 0xc);
                    local_1e4 = local_1e4 + 1) {
                  if (*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
                      *(int *)(*(long *)&ref_cell->n + (long)(&ref_malloc_init_i)[local_1e4] * 4)) {
                    uVar1 = ref_matrix_det_m2(metric + (&ref_malloc_init_i)[local_1e4] * 3,&exponent
                                             );
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x5a1,"ref_facelift_multiscale",(ulong)uVar1,"2x2 det");
                      return uVar1;
                    }
                    if (0.0 < exponent) {
                      dVar4 = sqrt(exponent);
                      area = (dVar4 * complexity_scale) / (double)*(int *)((long)hess + 0xc) + area;
                    }
                  }
                }
              }
            }
            if (area * 1e+20 <= 0.0) {
              local_2b0 = -(area * 1e+20);
            }
            else {
              local_2b0 = area * 1e+20;
            }
            if ((double)ref_facelift <= 0.0) {
              local_2c0 = (REF_FACELIFT)((ulong)ref_facelift ^ 0x8000000000000000);
            }
            else {
              local_2c0 = ref_facelift;
            }
            if (local_2b0 <= (double)local_2c0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x5ab,"ref_facelift_multiscale",4,"zero compelxity");
              ref_grid_local._4_4_ = 4;
            }
            else {
              for (dimension = 0; dimension < ref_cell->last_node_is_an_id;
                  dimension = dimension + 1) {
                if (((-1 < dimension) && (dimension < ref_cell->last_node_is_an_id)) &&
                   (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)dimension * 8))) {
                  for (p_norm = 0; p_norm < 3; p_norm = p_norm + 1) {
                    dVar4 = pow((double)ref_facelift / area,1.0);
                    iVar3 = p_norm + dimension * 3;
                    metric[iVar3] = dVar4 * metric[iVar3];
                  }
                }
              }
              for (dimension = 0; dimension < ref_cell->last_node_is_an_id;
                  dimension = dimension + 1) {
                if (((-1 < dimension) && (dimension < ref_cell->last_node_is_an_id)) &&
                   (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)dimension * 8))) {
                  uVar1 = ref_recon_rsn((REF_GRID)target_complexity_local,dimension,&local_198,
                                        &local_1b8,(REF_DBL *)&steps);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x5b6,"ref_facelift_multiscale",(ulong)uVar1,"rsn");
                    return uVar1;
                  }
                  uVar1 = ref_matrix_diag_m2(metric + dimension * 3,diag_system + 0xb);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x5b7,"ref_facelift_multiscale",(ulong)uVar1,"decomp");
                    return uVar1;
                  }
                  m[5] = diag_system[0xb];
                  for (p_norm = 0; p_norm < 3; p_norm = p_norm + 1) {
                    m[(long)(p_norm + 3) + 5] =
                         diag_system2[1] * r[(long)p_norm + -1] +
                         diag_system2[2] * s[(long)p_norm + -1];
                  }
                  for (p_norm = 0; p_norm < 3; p_norm = p_norm + 1) {
                    m[(long)(p_norm + 6) + 5] =
                         diag_system2[3] * r[(long)p_norm + -1] +
                         diag_system2[4] * s[(long)p_norm + -1];
                  }
                  if (diag_system[0xb] <= diag_system2[0]) {
                    local_2c8 = diag_system2[0];
                  }
                  else {
                    local_2c8 = diag_system[0xb];
                  }
                  diag_system[1] = local_2c8;
                  for (p_norm = 0; p_norm < 3; p_norm = p_norm + 1) {
                    m[(long)(p_norm + 9) + 5] = *(REF_DBL *)(&steps + (long)p_norm * 2);
                  }
                  uVar1 = ref_matrix_form_m(m + 5,_i + dimension * 6);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x5c8,"ref_facelift_multiscale",(ulong)uVar1,"form m");
                    return uVar1;
                  }
                }
              }
              if (metric != (REF_DBL *)0x0) {
                free(metric);
              }
              uVar1 = ref_recon_roundoff_limit(_i,(REF_GRID)target_complexity_local);
              if (uVar1 == 0) {
                uVar1 = ref_facelift_gradation_at_complexity
                                  (_i,(REF_GRID)target_complexity_local,(double)det._4_4_,
                                   (REF_DBL)ref_facelift);
                if (uVar1 == 0) {
                  for (dimension = 0; dimension < ref_cell->last_node_is_an_id;
                      dimension = dimension + 1) {
                    if (((-1 < dimension) && (dimension < ref_cell->last_node_is_an_id)) &&
                       (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)dimension * 8))) {
                      uVar1 = ref_node_metric_get((REF_NODE)ref_cell,dimension,combined + 5);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                               ,0x5e3,"ref_facelift_multiscale",(ulong)uVar1,"curve metric");
                        return uVar1;
                      }
                      uVar1 = ref_matrix_intersect(_i + dimension * 6,combined + 5,&local_178);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                               ,0x5e4,"ref_facelift_multiscale",(ulong)uVar1,"intersect");
                        return uVar1;
                      }
                      for (p_norm = 0; p_norm < 6; p_norm = p_norm + 1) {
                        _i[p_norm + dimension * 6] = combined[(long)p_norm + -1];
                      }
                    }
                  }
                  uVar1 = ref_metric_to_node(_i,*(REF_NODE *)((long)target_complexity_local + 8));
                  if (uVar1 == 0) {
                    if (_i != (REF_DBL *)0x0) {
                      free(_i);
                    }
                    ref_grid_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x5ed,"ref_facelift_multiscale",(ulong)uVar1,"to");
                    ref_grid_local._4_4_ = uVar1;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x5e0,"ref_facelift_multiscale",(ulong)uVar1,"gradation at complexity");
                  ref_grid_local._4_4_ = uVar1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x5d3,"ref_facelift_multiscale",(ulong)uVar1,"floor eigs above zero");
                ref_grid_local._4_4_ = uVar1;
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x594,"ref_facelift_multiscale",(ulong)uVar1,"rsn");
            ref_grid_local._4_4_ = uVar1;
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x58b,"ref_facelift_multiscale",(ulong)uVar1,"attach");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_multiscale(REF_GRID ref_grid,
                                           REF_DBL target_complexity) {
  REF_FACELIFT ref_facelift;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL *hess, *metric;
  REF_INT node, i;
  REF_INT dimension = 2, p_norm = 2;
  REF_INT gradation = -1.0;
  REF_DBL det, exponent, complexity, area, complexity_scale;
  REF_DBL diag_system2[6];
  REF_DBL diag_system[12];
  REF_DBL m[6], combined[6];
  REF_DBL r[3], s[3], n[3];
  REF_BOOL verbose = REF_FALSE;
  REF_BOOL steps = REF_FALSE;
  REF_INT cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];

  /* reset facelift to match grid */
  ref_facelift = ref_geom_facelift(ref_grid_geom(ref_grid));
  if (NULL != ref_facelift) ref_facelift_free(ref_facelift);
  ref_facelift = NULL;
  RSS(ref_facelift_attach(ref_grid), "attach");
  ref_facelift = ref_geom_facelift(ref_grid_geom(ref_grid));
  ref_cell = ref_facelift_tri(ref_facelift);

  exponent = -1.0 / ((REF_DBL)(2 * p_norm + dimension));

  ref_malloc(metric, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc_init(hess, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL,
                  0.0);
  RSS(ref_recon_rsn_hess_face(ref_grid, hess), "rsn");
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_det_m2(&(hess[3 * node]), &det), "2x2 det");
    if (det > 0.0) { /* local scaling */
      for (i = 0; i < 3; i++) hess[i + 3 * node] *= pow(det, exponent);
    }
  }

  complexity = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        RSS(ref_matrix_det_m2(&(hess[3 * nodes[cell_node]]), &det), "2x2 det");
        if (det > 0.0) {
          complexity +=
              sqrt(det) * area / ((REF_DBL)ref_cell_node_per(ref_cell));
        }
      }
    }
  }

  if (!ref_math_divisible(target_complexity, complexity)) {
    RSS(REF_DIV_ZERO, "zero compelxity");
  }

  complexity_scale = 1.0;
  each_ref_node_valid_node(ref_node, node) { /* global scaling */
    for (i = 0; i < 3; i++)
      hess[i + 3 * node] *=
          pow(target_complexity / complexity, complexity_scale);
  }

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
    RSS(ref_matrix_diag_m2(&(hess[3 * node]), diag_system2), "decomp");
    ref_matrix_eig(diag_system, 0) = ref_matrix_eig2(diag_system2, 0);
    for (i = 0; i < 3; i++) {
      ref_matrix_vec(diag_system, i, 0) =
          ref_matrix_vec2(diag_system2, 0, 0) * r[i] +
          ref_matrix_vec2(diag_system2, 1, 0) * s[i];
    }
    ref_matrix_eig(diag_system, 1) = ref_matrix_eig2(diag_system2, 1);
    for (i = 0; i < 3; i++) {
      ref_matrix_vec(diag_system, i, 1) =
          ref_matrix_vec2(diag_system2, 0, 1) * r[i] +
          ref_matrix_vec2(diag_system2, 1, 1) * s[i];
    }
    ref_matrix_eig(diag_system, 2) =
        MAX(ref_matrix_eig2(diag_system2, 0), ref_matrix_eig2(diag_system2, 1));
    for (i = 0; i < 3; i++) ref_matrix_vec(diag_system, i, 2) = n[i];

    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "form m");
    if (verbose) {
      ref_matrix_show_diag_sys(diag_system);
      ref_metric_show(&(metric[6 * node]));
      printf("n %f %f %f\n", n[0], n[1], n[2]);
      printf("v %f %f %f\n", diag_system[0 + 9], diag_system[1 + 9],
             diag_system[2 + 9]);
    }
  }
  ref_free(hess);

  RSS(ref_recon_roundoff_limit(metric, ref_grid), "floor eigs above zero");

  if (steps) {
    RSS(ref_metric_to_node(metric,
                           ref_grid_node(ref_facelift_grid(ref_facelift))),
        "to");
    RSS(ref_export_tec_metric_ellipse(ref_facelift_grid(ref_facelift),
                                      "ref_facelift_raw"),
        "al");
  }

  RSS(ref_facelift_gradation_at_complexity(metric, ref_grid, gradation,
                                           target_complexity),
      "gradation at complexity");

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "curve metric");
    RSS(ref_matrix_intersect(&(metric[6 * node]), m, combined), "intersect");
    if (verbose) {
      ref_metric_show(&(metric[6 * node]));
      ref_metric_show(m);
      ref_metric_show(combined);
      printf("\n");
    }
    for (i = 0; i < 6; i++) metric[i + 6 * node] = combined[i];
  }
  RSS(ref_metric_to_node(metric, ref_grid_node(ref_grid)), "to");

  if (steps) {
    RSS(ref_metric_to_node(metric,
                           ref_grid_node(ref_facelift_grid(ref_facelift))),
        "to");
    RSS(ref_export_tec_metric_ellipse(ref_facelift_grid(ref_facelift),
                                      "ref_facelift_grad"),
        "al");
  }

  ref_free(metric);

  return REF_SUCCESS;
}